

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::TriangleMesh::writeTo(TriangleMesh *this,BinaryWriter *binary)

{
  BinaryWriter *in_stack_00000048;
  Shape *in_stack_00000050;
  
  Shape::writeTo(in_stack_00000050,in_stack_00000048);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            ((BinaryWriter *)this,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)binary);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            ((BinaryWriter *)this,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)binary);
  BinaryWriter::write<pbrt::math::vec2f,std::allocator<pbrt::math::vec2f>,void>
            ((BinaryWriter *)this,
             (vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)binary);
  BinaryWriter::write<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>,void>
            ((BinaryWriter *)this,
             (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)binary);
  return 0x32;
}

Assistant:

int TriangleMesh::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(vertex);
    binary.write(normal);
    binary.write(texcoord);
    binary.write(index);
    return TYPE_TRIANGLE_MESH;
  }